

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O2

void opengv::absolute_pose::modules::gpnp5::sPolynomial15
               (Matrix<double,_44,_80,_0,_44,_80> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
          m_storage.m_data.array[0xa56];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x537] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xa82] / dVar1;
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
          m_storage.m_data.array[0xadd];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x563] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xaae] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb09] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x58f] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xada] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x5bb] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb06] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x5e7] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xb35] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x613] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xb61] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x66b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb32] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb8d] / dVar2;
  dVar3 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
          m_storage.m_data.array[0xb8a];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x697] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb5e] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x6c3] = dVar3 / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x6ef] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xbb9] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x747] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xbb6] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x79f] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xbe5] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x7cb] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xc11] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x823] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xbe2] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc3d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x84f] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc0e] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x87b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc3a] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x8a7] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xc69] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x8ff] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc66] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x957] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xc95] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x9af] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc92] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xa33] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xcc1] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xa5f] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xced] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xab7] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xcbe] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd19] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xae3] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xcea] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xb0f] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd16] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xb3b] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xd45] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xb93] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd42] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xbeb] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xd71] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xc43] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd6e] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xcc7] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xd9d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xd1f] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd9a] / dVar1;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp5::sPolynomial15( Eigen::Matrix<double,44,80> & groebnerMatrix )
{
  groebnerMatrix(15,30) = groebnerMatrix(6,61)/(groebnerMatrix(6,60));
  groebnerMatrix(15,31) = (groebnerMatrix(6,62)/(groebnerMatrix(6,60))-groebnerMatrix(9,64)/(groebnerMatrix(9,63)));
  groebnerMatrix(15,32) = groebnerMatrix(6,63)/(groebnerMatrix(6,60));
  groebnerMatrix(15,33) = groebnerMatrix(6,64)/(groebnerMatrix(6,60));
  groebnerMatrix(15,34) = -groebnerMatrix(9,65)/(groebnerMatrix(9,63));
  groebnerMatrix(15,35) = -groebnerMatrix(9,66)/(groebnerMatrix(9,63));
  groebnerMatrix(15,37) = (groebnerMatrix(6,65)/(groebnerMatrix(6,60))-groebnerMatrix(9,67)/(groebnerMatrix(9,63)));
  groebnerMatrix(15,38) = groebnerMatrix(6,66)/(groebnerMatrix(6,60));
  groebnerMatrix(15,39) = groebnerMatrix(6,67)/(groebnerMatrix(6,60));
  groebnerMatrix(15,40) = -groebnerMatrix(9,68)/(groebnerMatrix(9,63));
  groebnerMatrix(15,42) = groebnerMatrix(6,68)/(groebnerMatrix(6,60));
  groebnerMatrix(15,44) = -groebnerMatrix(9,69)/(groebnerMatrix(9,63));
  groebnerMatrix(15,45) = -groebnerMatrix(9,70)/(groebnerMatrix(9,63));
  groebnerMatrix(15,47) = (groebnerMatrix(6,69)/(groebnerMatrix(6,60))-groebnerMatrix(9,71)/(groebnerMatrix(9,63)));
  groebnerMatrix(15,48) = groebnerMatrix(6,70)/(groebnerMatrix(6,60));
  groebnerMatrix(15,49) = groebnerMatrix(6,71)/(groebnerMatrix(6,60));
  groebnerMatrix(15,50) = -groebnerMatrix(9,72)/(groebnerMatrix(9,63));
  groebnerMatrix(15,52) = groebnerMatrix(6,72)/(groebnerMatrix(6,60));
  groebnerMatrix(15,54) = -groebnerMatrix(9,73)/(groebnerMatrix(9,63));
  groebnerMatrix(15,56) = groebnerMatrix(6,73)/(groebnerMatrix(6,60));
  groebnerMatrix(15,59) = -groebnerMatrix(9,74)/(groebnerMatrix(9,63));
  groebnerMatrix(15,60) = -groebnerMatrix(9,75)/(groebnerMatrix(9,63));
  groebnerMatrix(15,62) = (groebnerMatrix(6,74)/(groebnerMatrix(6,60))-groebnerMatrix(9,76)/(groebnerMatrix(9,63)));
  groebnerMatrix(15,63) = groebnerMatrix(6,75)/(groebnerMatrix(6,60));
  groebnerMatrix(15,64) = groebnerMatrix(6,76)/(groebnerMatrix(6,60));
  groebnerMatrix(15,65) = -groebnerMatrix(9,77)/(groebnerMatrix(9,63));
  groebnerMatrix(15,67) = groebnerMatrix(6,77)/(groebnerMatrix(6,60));
  groebnerMatrix(15,69) = -groebnerMatrix(9,78)/(groebnerMatrix(9,63));
  groebnerMatrix(15,71) = groebnerMatrix(6,78)/(groebnerMatrix(6,60));
  groebnerMatrix(15,74) = -groebnerMatrix(9,79)/(groebnerMatrix(9,63));
  groebnerMatrix(15,76) = groebnerMatrix(6,79)/(groebnerMatrix(6,60));
}